

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb *pRB,ma_uint32 subbufferIndex)

{
  uint uVar1;
  
  if (pRB != (ma_pcm_rb *)0x0) {
    uVar1 = (pRB->rb).subbufferStrideInBytes;
    if (uVar1 == 0) {
      uVar1 = (pRB->rb).subbufferSizeInBytes;
    }
    return (ma_uint32)
           (((ulong)uVar1 * (ulong)subbufferIndex) /
           (ulong)((&DAT_0017d490)[pRB->format] * pRB->channels));
  }
  return 0;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb* pRB, ma_uint32 subbufferIndex)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_offset(&pRB->rb, subbufferIndex) / ma_pcm_rb_get_bpf(pRB));
}